

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framework.h
# Opt level: O0

void __thiscall test_fixture::test_fixture(test_fixture *this,string *fixture_name)

{
  string *fixture_name_local;
  test_fixture *this_local;
  
  this->_vptr_test_fixture = (_func_int **)&PTR__test_fixture_00123d10;
  (this->_tests).super__Vector_base<test_host,_std::allocator<test_host>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_tests).super__Vector_base<test_host,_std::allocator<test_host>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_tests).super__Vector_base<test_host,_std::allocator<test_host>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<test_host,_std::allocator<test_host>_>::vector(&this->_tests);
  this->_something_failed = false;
  std::__cxx11::string::string((string *)&this->_fixture_name,(string *)fixture_name);
  return;
}

Assistant:

test_fixture(std::string fixture_name)
        : _tests(),
          _something_failed( false ),
          _fixture_name( fixture_name )
    {
    }